

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

shared_ptr<pstore::index::details::internal_node> __thiscall
anon_unknown.dwarf_10ddcf::CorruptInternalNodes::load_inode
          (CorruptInternalNodes *this,index_pointer ptr)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstore::index::details::internal_node> sVar2;
  typed_address<pstore::index::details::internal_node> local_40;
  size_t local_38;
  undefined1 local_30 [24];
  CorruptInternalNodes *this_local;
  index_pointer ptr_local;
  
  local_30._16_8_ = ptr;
  ptr_local = (index_pointer)this;
  bVar1 = pstore::index::details::index_pointer::is_internal((index_pointer *)&this_local);
  if (!bVar1) {
    pstore::assert_failed
              ("ptr.is_internal ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x6b0);
  }
  local_40 = pstore::index::details::index_pointer::
             untag_address<pstore::index::details::internal_node,void>((index_pointer *)&this_local)
  ;
  local_38 = (size_t)pstore::typed_address<pstore::index::details::internal_node>::to_address
                               (&local_40);
  pstore::index::details::internal_node::size_bytes(2);
  pstore::database::getrw((database *)local_30,(address)&ptr.internal_[2].bitmap_,local_38);
  std::static_pointer_cast<pstore::index::details::internal_node,void>((shared_ptr<void> *)this);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_30);
  sVar2.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<pstore::index::details::internal_node>)
         sVar2.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<internal_node> CorruptInternalNodes::load_inode (index_pointer ptr) {
        PSTORE_ASSERT (ptr.is_internal ());
        return std::static_pointer_cast<internal_node> (
            db_.getrw (ptr.untag_address<internal_node> ().to_address (),
                       internal_node::size_bytes (internal_node_children)));
    }